

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O3

int run_test_thread_rwlock(void)

{
  int iVar1;
  undefined8 *extraout_RDX;
  uv_rwlock_t *unaff_RBX;
  int iVar2;
  int64_t eval_b;
  int64_t eval_a;
  uv_rwlock_t rwlock;
  undefined1 auStack_100 [16];
  code *pcStack_f0;
  long lStack_e8;
  long lStack_e0;
  undefined1 auStack_d8 [16];
  uv_cond_t *puStack_c8;
  long lStack_c0;
  long lStack_b8;
  uv_rwlock_t *puStack_b0;
  long lStack_68;
  undefined1 local_40 [56];
  
  iVar1 = uv_rwlock_init(local_40);
  if (iVar1 == 0) {
    uv_rwlock_rdlock(local_40);
    uv_rwlock_rdunlock(local_40);
    uv_rwlock_wrlock(local_40);
    uv_rwlock_wrunlock(local_40);
    uv_rwlock_destroy(local_40);
    return 0;
  }
  run_test_thread_rwlock_cold_1();
  iVar1 = uv_cond_init(&condvar);
  lStack_68 = (long)iVar1;
  if (lStack_68 == 0) {
    iVar1 = uv_mutex_init(&mutex);
    lStack_68 = (long)iVar1;
    if (lStack_68 != 0) goto LAB_001ae5f3;
    iVar1 = uv_rwlock_init(&::rwlock);
    lStack_68 = (long)iVar1;
    if (lStack_68 != 0) goto LAB_001ae602;
    uv_mutex_lock(&mutex);
    iVar1 = uv_thread_create(&lStack_68,thread_rwlock_trylock_peer,0);
    if (iVar1 != 0) goto LAB_001ae611;
    iVar1 = uv_rwlock_trywrlock(&::rwlock);
    if (iVar1 != 0) goto LAB_001ae620;
    synchronize();
    unaff_RBX = &::rwlock;
    uv_rwlock_wrunlock(&::rwlock);
    iVar1 = uv_rwlock_tryrdlock(&::rwlock);
    if (iVar1 != 0) goto LAB_001ae62f;
    synchronize();
    unaff_RBX = &::rwlock;
    uv_rwlock_rdunlock(&::rwlock);
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&::rwlock);
    if (iVar1 != -0x10) goto LAB_001ae63e;
    iVar1 = uv_rwlock_trywrlock(&::rwlock);
    if (iVar1 != -0x10) goto LAB_001ae64d;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&::rwlock);
    if (iVar1 != 0) goto LAB_001ae65c;
    unaff_RBX = &::rwlock;
    uv_rwlock_rdunlock(&::rwlock);
    iVar1 = uv_rwlock_trywrlock(&::rwlock);
    if (iVar1 != -0x10) goto LAB_001ae66b;
    synchronize();
    iVar1 = uv_thread_join(&lStack_68);
    if (iVar1 == 0) {
      uv_rwlock_destroy(&::rwlock);
      uv_mutex_unlock(&mutex);
      uv_mutex_destroy(&mutex);
      uv_cond_destroy(&condvar);
      return 0;
    }
  }
  else {
    run_test_thread_rwlock_trylock_cold_1();
LAB_001ae5f3:
    run_test_thread_rwlock_trylock_cold_2();
LAB_001ae602:
    run_test_thread_rwlock_trylock_cold_3();
LAB_001ae611:
    run_test_thread_rwlock_trylock_cold_4();
LAB_001ae620:
    run_test_thread_rwlock_trylock_cold_5();
LAB_001ae62f:
    run_test_thread_rwlock_trylock_cold_6();
LAB_001ae63e:
    run_test_thread_rwlock_trylock_cold_7();
LAB_001ae64d:
    run_test_thread_rwlock_trylock_cold_8();
LAB_001ae65c:
    run_test_thread_rwlock_trylock_cold_9();
LAB_001ae66b:
    run_test_thread_rwlock_trylock_cold_10();
  }
  run_test_thread_rwlock_trylock_cold_11();
  uv_mutex_lock(&mutex);
  iVar1 = uv_rwlock_tryrdlock(&::rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&::rwlock);
    if (iVar1 != -0x10) goto LAB_001ae7f8;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&::rwlock);
    if (iVar1 != 0) goto LAB_001ae805;
    unaff_RBX = &::rwlock;
    uv_rwlock_rdunlock(&::rwlock);
    iVar1 = uv_rwlock_trywrlock(&::rwlock);
    if (iVar1 != -0x10) goto LAB_001ae812;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&::rwlock);
    if (iVar1 != 0) goto LAB_001ae81f;
    synchronize();
    unaff_RBX = &::rwlock;
    uv_rwlock_wrunlock(&::rwlock);
    iVar1 = uv_rwlock_tryrdlock(&::rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_rdunlock(&::rwlock);
      step = step + 1;
      uv_cond_signal(&condvar);
      iVar1 = uv_mutex_unlock(&mutex);
      return iVar1;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_001ae7f8:
    thread_rwlock_trylock_peer_cold_2();
LAB_001ae805:
    thread_rwlock_trylock_peer_cold_3();
LAB_001ae812:
    thread_rwlock_trylock_peer_cold_4();
LAB_001ae81f:
    thread_rwlock_trylock_peer_cold_5();
  }
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  puStack_c8 = (uv_cond_t *)0x1ae857;
  puStack_b0 = unaff_RBX;
  uv_cond_signal(&condvar);
  iVar1 = step;
  lStack_c0 = (long)step;
  do {
    puStack_c8 = (uv_cond_t *)0x1ae870;
    uv_cond_wait(&condvar,&mutex);
    lStack_b8 = (long)step;
  } while (iVar1 == step);
  lStack_c0 = lStack_c0 + 1;
  if (lStack_b8 == lStack_c0) {
    return step;
  }
  puStack_c8 = (uv_cond_t *)0x1ae8aa;
  synchronize_cold_1();
  puStack_c8 = &condvar;
  iVar2 = (int)&lStack_e8;
  pcStack_f0 = (code *)0x1ae8c7;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_d8);
  lStack_e0 = (long)iVar1;
  lStack_e8 = 0;
  if (lStack_e0 == 0) {
    pcStack_f0 = (code *)0x1ae8f1;
    iVar1 = uv_loop_init(&loop);
    lStack_e0 = (long)iVar1;
    lStack_e8 = 0;
    if (lStack_e0 != 0) goto LAB_001aea97;
    pcStack_f0 = (code *)0x1ae922;
    iVar1 = uv_tcp_init(&loop,&tcp_client);
    lStack_e0 = (long)iVar1;
    lStack_e8 = 0;
    if (lStack_e0 != 0) goto LAB_001aeaa4;
    pcStack_f0 = (code *)0x1ae95f;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,auStack_d8,connect_cb);
    lStack_e0 = (long)iVar1;
    lStack_e8 = 0;
    if (lStack_e0 != 0) goto LAB_001aeab1;
    pcStack_f0 = (code *)0x1ae98b;
    iVar1 = uv_run(&loop,0);
    lStack_e0 = (long)iVar1;
    lStack_e8 = 0;
    if (lStack_e0 != 0) goto LAB_001aeabe;
    lStack_e0 = 1;
    lStack_e8 = (long)connect_cb_called;
    if (lStack_e8 != 1) goto LAB_001aeacb;
    lStack_e0 = 1;
    lStack_e8 = (long)read_cb_called;
    if (lStack_e8 != 1) goto LAB_001aead8;
    lStack_e0 = 1;
    lStack_e8 = (long)write_cb_called;
    if (lStack_e8 != 1) goto LAB_001aeae5;
    lStack_e0 = 1;
    lStack_e8 = (long)close_cb_called;
    if (lStack_e8 != 1) goto LAB_001aeaf2;
    pcStack_f0 = (code *)0x1aea4d;
    uv_walk(&loop,close_walk_cb,0);
    pcStack_f0 = (code *)0x1aea57;
    uv_run(&loop,0);
    lStack_e0 = 0;
    pcStack_f0 = (code *)0x1aea68;
    iVar1 = uv_loop_close(&loop);
    lStack_e8 = (long)iVar1;
    if (lStack_e0 == lStack_e8) {
      pcStack_f0 = (code *)0x1aea82;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_f0 = (code *)0x1aea97;
    run_test_not_readable_nor_writable_on_read_error_cold_1();
LAB_001aea97:
    pcStack_f0 = (code *)0x1aeaa4;
    run_test_not_readable_nor_writable_on_read_error_cold_2();
LAB_001aeaa4:
    pcStack_f0 = (code *)0x1aeab1;
    run_test_not_readable_nor_writable_on_read_error_cold_3();
LAB_001aeab1:
    pcStack_f0 = (code *)0x1aeabe;
    run_test_not_readable_nor_writable_on_read_error_cold_4();
LAB_001aeabe:
    pcStack_f0 = (code *)0x1aeacb;
    run_test_not_readable_nor_writable_on_read_error_cold_5();
LAB_001aeacb:
    pcStack_f0 = (code *)0x1aead8;
    run_test_not_readable_nor_writable_on_read_error_cold_6();
LAB_001aead8:
    pcStack_f0 = (code *)0x1aeae5;
    run_test_not_readable_nor_writable_on_read_error_cold_7();
LAB_001aeae5:
    pcStack_f0 = (code *)0x1aeaf2;
    run_test_not_readable_nor_writable_on_read_error_cold_8();
LAB_001aeaf2:
    pcStack_f0 = (code *)0x1aeaff;
    run_test_not_readable_nor_writable_on_read_error_cold_9();
  }
  pcStack_f0 = connect_cb;
  run_test_not_readable_nor_writable_on_read_error_cold_10();
  connect_cb_called = connect_cb_called + 1;
  auStack_100._0_8_ = SEXT48(iVar2);
  if (auStack_100._0_8_ == 0) {
    iVar1 = uv_read_start(&tcp_client,alloc_cb,read_cb);
    auStack_100._0_8_ = SEXT48(iVar1);
    if (auStack_100._0_8_ == 0) {
      auStack_100 = uv_buf_init(reset_me_cmd,3);
      iVar1 = uv_write(&write_req,&tcp_client,auStack_100,1,write_cb);
      pcStack_f0 = (code *)0x0;
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001aebeb;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001aebeb:
  connect_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x40;
  return 0x36e800;
}

Assistant:

TEST_IMPL(thread_rwlock) {
  uv_rwlock_t rwlock;
  int r;

  r = uv_rwlock_init(&rwlock);
  ASSERT_OK(r);

  uv_rwlock_rdlock(&rwlock);
  uv_rwlock_rdunlock(&rwlock);
  uv_rwlock_wrlock(&rwlock);
  uv_rwlock_wrunlock(&rwlock);
  uv_rwlock_destroy(&rwlock);

  return 0;
}